

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.hpp
# Opt level: O0

void __thiscall BinarySearchTree<int>::~BinarySearchTree(BinarySearchTree<int> *this)

{
  shared_ptr<BinarySearchTree<int>::Node> local_20;
  BinarySearchTree<int> *local_10;
  BinarySearchTree<int> *this_local;
  
  local_10 = this;
  std::shared_ptr<BinarySearchTree<int>::Node>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<BinarySearchTree<int>::Node>::operator=(&this->root_,&local_20);
  std::shared_ptr<BinarySearchTree<int>::Node>::~shared_ptr(&local_20);
  this->size_ = 0;
  std::shared_ptr<BinarySearchTree<int>::Node>::~shared_ptr(&this->root_);
  return;
}

Assistant:

~BinarySearchTree()
    {
        root_ = nullptr;
        size_ = 0;
    }